

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimSeq.c
# Opt level: O3

int Raig_ManSimulateRound(Raig_Man_t *p,int fMiter,int fFirst,int *piPat)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int i;
  ulong uVar13;
  
  pVVar3 = p->vCis2Ids;
  if (0 < pVVar3->nSize) {
    lVar9 = 0;
    do {
      iVar10 = pVVar3->pArray[lVar9];
      uVar2 = iVar10 - p->nPis;
      if (p->nPis <= iVar10) {
        if (((int)uVar2 < 0) || (p->vLos->nSize <= (int)uVar2)) goto LAB_0066cdae;
        puVar4 = Raig_ManSimRef(p,p->vLos->pArray[uVar2]);
        if (fFirst == 0) {
          uVar2 = iVar10 - p->nPis;
          if (((int)uVar2 < 0) || (p->vLis->nSize <= (int)uVar2)) goto LAB_0066cdae;
          puVar5 = Raig_ManSimDeref(p,p->vLis->pArray[uVar2]);
          if (0 < p->nWords) {
            lVar8 = 0;
            do {
              puVar4[lVar8 + 1] = puVar5[lVar8 + 1];
              lVar8 = lVar8 + 1;
            } while (lVar8 < p->nWords);
          }
        }
        else {
          memset(puVar4 + 1,0,(long)p->nWords << 2);
        }
        if (*puVar4 == 0) {
          *puVar4 = 1;
          uVar2 = iVar10 - p->nPis;
          if (((int)uVar2 < 0) || (p->vLos->nSize <= (int)uVar2)) goto LAB_0066cdae;
          Raig_ManSimDeref(p,p->vLos->pArray[uVar2]);
        }
      }
      lVar9 = lVar9 + 1;
      pVVar3 = p->vCis2Ids;
    } while (lVar9 < pVVar3->nSize);
  }
  iVar10 = 0;
  iVar12 = 0;
  if (2 < p->nObjs) {
    iVar12 = 0;
    uVar13 = 2;
    uVar11 = 0;
    do {
      iVar10 = (int)uVar11;
      i = (int)uVar13;
      if (p->pFans0[uVar13] == 0) {
        if ((iVar10 < 0) || (p->vCis2Ids->nSize <= iVar10)) {
LAB_0066cdae:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = p->vCis2Ids->pArray[uVar11];
        uVar2 = iVar1 - p->nPis;
        if (iVar1 < p->nPis) {
          puVar4 = Raig_ManSimRef(p,i);
          if (0 < p->nWords) {
            lVar9 = 0;
            do {
              uVar2 = Aig_ManRandom(0);
              puVar4[lVar9 + 1] = uVar2;
              lVar9 = lVar9 + 1;
            } while (lVar9 < p->nWords);
          }
          if (*puVar4 == 0) {
            *puVar4 = 1;
            Raig_ManSimDeref(p,i);
          }
        }
        else {
          if (((int)uVar2 < 0) || (p->vLos->nSize <= (int)uVar2)) goto LAB_0066cdae;
          if (uVar13 != (uint)p->vLos->pArray[uVar2]) {
            __assert_fail("Vec_IntEntry(p->vLos, iPioNum-p->nPis) == i",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                          ,0x15d,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
          }
        }
        uVar11 = (ulong)(iVar10 + 1);
      }
      else if (p->pFans1[uVar13] == 0) {
        puVar4 = Raig_ManSimDeref(p,p->pFans0[uVar13] >> 1);
        if ((fMiter == 0) || (p->nPos <= iVar12)) {
          puVar5 = Raig_ManSimRef(p,i);
          if (*puVar5 != 1) {
            __assert_fail("pRes[0] == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                          ,0x171,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
          }
          if ((*(byte *)(p->pFans0 + uVar13) & 1) == 0) {
            if (0 < p->nWords) {
              lVar9 = 0;
              do {
                puVar5[lVar9 + 1] = puVar4[lVar9 + 1];
                lVar9 = lVar9 + 1;
              } while (lVar9 < p->nWords);
            }
          }
          else if (0 < p->nWords) {
            lVar9 = 0;
            do {
              puVar5[lVar9 + 1] = ~puVar4[lVar9 + 1];
              lVar9 = lVar9 + 1;
            } while (lVar9 < p->nWords);
          }
        }
        else if (0 < p->nWords) {
          uVar2 = -(p->pFans0[uVar13] & 1U);
          lVar9 = 0;
          do {
            puVar4 = puVar4 + 1;
            if (*puVar4 != uVar2) {
              uVar7 = 0;
              goto LAB_0066cd82;
            }
            lVar9 = lVar9 + -0x20;
          } while ((ulong)(uint)p->nWords * 0x20 + lVar9 != 0);
        }
        iVar12 = iVar12 + 1;
      }
      else {
        puVar4 = Raig_ManSimRef(p,i);
        if (*puVar4 == 0) {
          __assert_fail("pRes[0] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                        ,0x17d,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
        }
        uVar2 = p->pFans0[uVar13];
        uVar7 = p->pFans1[uVar13];
        puVar5 = Raig_ManSimDeref(p,(int)uVar2 >> 1);
        puVar6 = Raig_ManSimDeref(p,p->pFans1[uVar13] >> 1);
        iVar10 = p->nWords;
        if ((uVar2 & 1) == 0) {
          if ((uVar7 & 1) == 0) {
            if (0 < iVar10) {
              lVar9 = 0;
              do {
                puVar4[lVar9 + 1] = puVar6[lVar9 + 1] & puVar5[lVar9 + 1];
                lVar9 = lVar9 + 1;
              } while (lVar9 < p->nWords);
            }
          }
          else if (0 < iVar10) {
            lVar9 = 0;
            do {
              puVar4[lVar9 + 1] = ~puVar6[lVar9 + 1] & puVar5[lVar9 + 1];
              lVar9 = lVar9 + 1;
            } while (lVar9 < p->nWords);
          }
        }
        else if ((uVar7 & 1) == 0) {
          if (0 < iVar10) {
            lVar9 = 0;
            do {
              puVar4[lVar9 + 1] = ~puVar5[lVar9 + 1] & puVar6[lVar9 + 1];
              lVar9 = lVar9 + 1;
            } while (lVar9 < p->nWords);
          }
        }
        else if (0 < iVar10) {
          lVar9 = 0;
          do {
            puVar4[lVar9 + 1] = ~(puVar6[lVar9 + 1] | puVar5[lVar9 + 1]);
            lVar9 = lVar9 + 1;
          } while (lVar9 < p->nWords);
        }
      }
      iVar10 = (int)uVar11;
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)p->nObjs);
  }
  if (iVar10 != p->nCis) {
    __assert_fail("nCis == p->nCis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                  ,399,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
  }
  if (iVar12 != p->nCos) {
    __assert_fail("nCos == p->nCos",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                  ,400,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
  }
  uVar13 = 0;
  if (p->nMems != p->vLis->nSize + 1) {
    __assert_fail("p->nMems == 1 + Vec_IntSize(p->vLis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                  ,0x191,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
  }
  goto LAB_0066cd9c;
  while (uVar7 = uVar7 + 1, uVar7 != 0x20) {
LAB_0066cd82:
    if (((*puVar4 ^ uVar2) >> (uVar7 & 0x1f) & 1) != 0) goto LAB_0066cd93;
  }
  uVar7 = 0xffffffff;
LAB_0066cd93:
  *piPat = uVar7 - (int)lVar9;
LAB_0066cd9c:
  return (int)uVar13;
}

Assistant:

int Raig_ManSimulateRound( Raig_Man_t * p, int fMiter, int fFirst, int * piPat )
{ 
    unsigned * pRes0, * pRes1, * pRes;
    int i, w, nCis, nCos, iFan0, iFan1, iPioNum;
    // nove the values to the register outputs
    Vec_IntForEachEntry( p->vCis2Ids, iPioNum, i )
    {
        if ( iPioNum < p->nPis )
            continue;
        pRes = Raig_ManSimRef( p, Vec_IntEntry(p->vLos, iPioNum-p->nPis) );
        if ( fFirst )
            memset( pRes + 1, 0, sizeof(unsigned) * p->nWords );
        else
        {
            pRes0 = Raig_ManSimDeref( p, Vec_IntEntry(p->vLis, iPioNum-p->nPis) );
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = pRes0[w];
        }
        // handle unused PIs
        if ( pRes[0] == 0 ) 
        {
            pRes[0] = 1;
            Raig_ManSimDeref( p, Vec_IntEntry(p->vLos, iPioNum-p->nPis) );
        }
    }
    // simulate the logic
    nCis = nCos = 0;
    for ( i = 2; i < p->nObjs; i++ )
    {
        if ( p->pFans0[i] == 0 ) // ci always has zero first fanin
        {
            iPioNum = Vec_IntEntry( p->vCis2Ids, nCis );
            if ( iPioNum < p->nPis )
            {
                pRes = Raig_ManSimRef( p, i );
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = Aig_ManRandom( 0 );
                // handle unused PIs
                if ( pRes[0] == 0 ) 
                {
                    pRes[0] = 1;
                    Raig_ManSimDeref( p, i );
                }
            }
            else
                assert( Vec_IntEntry(p->vLos, iPioNum-p->nPis) == i );
            nCis++;
            continue;
        }
        if ( p->pFans1[i] == 0 ) // co always has non-zero 1st fanin and zero 2nd fanin
        {
            pRes0 = Raig_ManSimDeref( p, Raig_Lit2Var(p->pFans0[i]) );
            if ( nCos < p->nPos && fMiter )
            {
                unsigned Const = Raig_LitIsCompl(p->pFans0[i])? ~0 : 0;
                for ( w = 1; w <= p->nWords; w++ )
                    if ( pRes0[w] != Const )
                    {
                        *piPat = 32*(w-1) + Aig_WordFindFirstBit( pRes0[w] ^ Const );
                        return i;
                    }
            }
            else
            {
                pRes = Raig_ManSimRef( p, i );
                assert( pRes[0] == 1 );
                if ( Raig_LitIsCompl(p->pFans0[i]) )
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w] = ~pRes0[w];
                else
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w] = pRes0[w];
            }
            nCos++;
            continue;
        }
        pRes  = Raig_ManSimRef( p, i );
        assert( pRes[0] > 0 );
        iFan0 = p->pFans0[i];
        iFan1 = p->pFans1[i];
        pRes0 = Raig_ManSimDeref( p, Raig_Lit2Var(p->pFans0[i]) );
        pRes1 = Raig_ManSimDeref( p, Raig_Lit2Var(p->pFans1[i]) );
        if ( Raig_LitIsCompl(iFan0) && Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = ~(pRes0[w] | pRes1[w]);
        else if ( Raig_LitIsCompl(iFan0) && !Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = ~pRes0[w] & pRes1[w];
        else if ( !Raig_LitIsCompl(iFan0) && Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = pRes0[w] & ~pRes1[w];
        else if ( !Raig_LitIsCompl(iFan0) && !Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = pRes0[w] & pRes1[w];
    }
    assert( nCis == p->nCis );
    assert( nCos == p->nCos );
    assert( p->nMems == 1 + Vec_IntSize(p->vLis) );
    return 0;
}